

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.cpp
# Opt level: O0

u32 __thiscall tl::calcSizeUtf32(tl *this,CStr o)

{
  char cVar1;
  u32 uVar2;
  uint local_28;
  u32 local_24;
  u32 i;
  u32 size;
  CStr o_local;
  
  o_local._0_8_ = o._0_8_;
  i = (u32)this;
  local_24 = 0;
  local_28 = 0;
  do {
    uVar2 = CStrT<char>::size((CStrT<char> *)&i);
    if (uVar2 <= local_28) {
      return local_24;
    }
    cVar1 = CStrT<char>::operator[]((CStrT<char> *)&i,local_28);
    if (((int)cVar1 & 0x80U) == 0) {
      local_28 = local_28 + 1;
    }
    else {
      cVar1 = CStrT<char>::operator[]((CStrT<char> *)&i,local_28);
      if (((int)cVar1 & 0xe0U) == 0xc0) {
        local_28 = local_28 + 2;
      }
      else {
        cVar1 = CStrT<char>::operator[]((CStrT<char> *)&i,local_28);
        if (((int)cVar1 & 0xf0U) == 0xe0) {
          local_28 = local_28 + 3;
        }
        else {
          cVar1 = CStrT<char>::operator[]((CStrT<char> *)&i,local_28);
          if (((int)cVar1 & 0xf8U) != 0xf0) {
            return 0xffffffff;
          }
          local_28 = local_28 + 4;
        }
      }
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

u32 calcSizeUtf32(CStr o)
{
    u32 size = 0;
    for(u32 i=0; i<o.size(); ) {
        if((o[i] & 0b10000000) == 0) { // 1 byte
            i++;
            size++;
        }
        else if((o[i] & 0b11100000) == 0b11000000) { // 2 bytes
            i += 2;
            size++;
        }
        else if((o[i] & 0b11110000) == 0b11100000) { // 3 bytes
            i += 3;
            size++;
        }
        else if((o[i] & 0b11111000) == 0b11110000) { // 4 bytes
            i += 4;
            size++;
        }
        else {
            return TOKEN_ERROR;
        }
    }
    return size;
}